

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_common.hpp
# Opt level: O0

key_encoder * __thiscall unodb::key_encoder::encode(key_encoder *this,uint64_t v)

{
  undefined8 uVar1;
  unsigned_long u;
  uint64_t v_local;
  key_encoder *this_local;
  
  ensure_available(this,8);
  uVar1 = detail::bswap<unsigned_long>(v);
  *(undefined8 *)(this->buf + this->off) = uVar1;
  this->off = this->off + 8;
  return this;
}

Assistant:

key_encoder &encode(std::uint64_t v) {
    ensure_available(sizeof(v));
#ifdef UNODB_DETAIL_LITTLE_ENDIAN
    const auto u = unodb::detail::bswap(v);
#else
    const auto u = v;
#endif
    UNODB_DETAIL_ASSERT(sizeof(u) == sizeof(v));
    std::memcpy(buf + off, &u, sizeof(v));
    off += sizeof(v);
    return *this;
  }